

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

bool check_catch(CHAR_DATA *ch,CHAR_DATA *victim,OBJ_DATA *obj)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  OBJ_DATA *pOVar4;
  char *pcVar5;
  
  bVar1 = is_npc(ch);
  if (((((bVar1) || (bVar1 = style_check((int)gsn_catch,(int)ch->pcdata->style), bVar1)) &&
       (iVar2 = get_skill(ch,(int)gsn_catch), iVar2 != 0)) &&
      (((pOVar4 = get_eq_char(ch,0xb), pOVar4 == (OBJ_DATA *)0x0 &&
        (pOVar4 = get_eq_char(ch,0x12), pOVar4 == (OBJ_DATA *)0x0)) ||
       (pOVar4 = get_eq_char(ch,0x10), pOVar4 == (OBJ_DATA *)0x0)))) &&
     (bVar1 = can_see_obj(ch,obj), bVar1)) {
    iVar3 = number_percent();
    if ((double)iVar2 * 0.9 < (double)iVar3) {
      act("You attempt to grab $N\'s disarmed weapon, but fail to catch it.",ch,(void *)0x0,victim,3
         );
      act("$n tries to catch your weapon as it falls to the ground.",ch,(void *)0x0,victim,2);
      act("$n attempts to grab for $N\'s disarmed weapon, but fails to catch it!",ch,(void *)0x0,
          victim,1);
      return false;
    }
    pcVar5 = weapon_name_lookup(obj->value[0],"weapon");
    act("As $N\'s $t hurtles through the air, you reach out and catch it!",ch,pcVar5,victim,3);
    pcVar5 = weapon_name_lookup(obj->value[0],"weapon");
    act("As your $t hurtles through the air, $n reaches out and catches it in midair!",ch,pcVar5,
        victim,2);
    pcVar5 = weapon_name_lookup(obj->value[0],"weapon");
    act("As $N\'s $t hurtles through the air, $n reaches out and catches it in midair!",ch,pcVar5,
        victim,1);
    return true;
  }
  return false;
}

Assistant:

bool check_catch(CHAR_DATA *ch, CHAR_DATA *victim, OBJ_DATA *obj)
{
	int chance = 0;

	if (!is_npc(ch))
	{
		if (!style_check(gsn_catch, ch->pcdata->style))
			return false;
	}

	chance = get_skill(ch, gsn_catch);

	if (chance == 0)
		return false;

	if ((get_eq_char(ch, WEAR_SHIELD) != nullptr || get_eq_char(ch, WEAR_DUAL_WIELD) != nullptr)
		&& get_eq_char(ch, WEAR_WIELD) != nullptr)
	{
		return false;
	}

	if (!can_see_obj(ch, obj))
		return false;

	if (number_percent() > (chance * .9))
	{
		act("You attempt to grab $N's disarmed weapon, but fail to catch it.", ch, 0, victim, TO_CHAR);
		act("$n tries to catch your weapon as it falls to the ground.", ch, 0, victim, TO_VICT);
		act("$n attempts to grab for $N's disarmed weapon, but fails to catch it!", ch, 0, victim, TO_NOTVICT);
		return false;
	}
	else
	{
		act("As $N's $t hurtles through the air, you reach out and catch it!", ch, weapon_name_lookup(obj->value[0]), victim, TO_CHAR);
		act("As your $t hurtles through the air, $n reaches out and catches it in midair!", ch, weapon_name_lookup(obj->value[0]), victim, TO_VICT);
		act("As $N's $t hurtles through the air, $n reaches out and catches it in midair!", ch, weapon_name_lookup(obj->value[0]), victim, TO_NOTVICT);
		return true;
	}
}